

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::
     eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int_const*,unsigned_int_const*,unsigned_int*>
               (uint *r,uint *a,uint *b,unsigned_fast_type n,uint *t)

{
  uint *puVar1;
  uint *b_00;
  uint *r_00;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  unsigned_fast_type i_4;
  ulong uVar5;
  long lVar6;
  unsigned_fast_type uVar7;
  bool bVar8;
  ulong uVar9;
  ulong n_00;
  uint *a_00;
  byte bVar10;
  byte bVar11;
  
  if (n < 0x31) {
    eval_multiply_n_by_n_to_2n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(r,a,b,n);
    return;
  }
  n_00 = n >> 1;
  a_00 = a + n_00;
  puVar1 = b + n_00;
  b_00 = t + n_00;
  eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int_const*,unsigned_int_const*,unsigned_int*>
            (r + n,a_00,puVar1,n_00,t);
  eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int_const*,unsigned_int_const*,unsigned_int*>
            (r,a,b,n_00,t);
  lVar6 = 0;
  do {
    *(undefined4 *)((long)t + lVar6) = *(undefined4 *)((long)r + lVar6);
    lVar6 = lVar6 + 4;
  } while (n * 8 - lVar6 != 0);
  r_00 = t + n;
  uVar7 = 0;
  uVar5 = 0;
  do {
    uVar9 = (ulong)r_00[uVar7] + r[n_00 + uVar7] + uVar5;
    uVar5 = uVar9 >> 0x20;
    r[n_00 + uVar7] = (uint)uVar9;
    uVar7 = uVar7 + 1;
  } while (n != uVar7);
  if (uVar9 >> 0x20 != 0) {
    uVar9 = 1;
    do {
      puVar2 = r + n_00 + n + (uVar9 - 1);
      uVar3 = *puVar2;
      uVar4 = (uint)uVar5;
      *puVar2 = *puVar2 + uVar4;
      if (n_00 <= uVar9) break;
      uVar5 = (ulong)CARRY4(uVar3,uVar4);
      uVar9 = uVar9 + 1;
    } while (CARRY4(uVar3,uVar4));
  }
  uVar7 = 0;
  uVar5 = 0;
  do {
    uVar9 = (ulong)t[uVar7] + r[n_00 + uVar7] + uVar5;
    uVar5 = uVar9 >> 0x20;
    r[n_00 + uVar7] = (uint)uVar9;
    uVar7 = uVar7 + 1;
  } while (n != uVar7);
  if (uVar9 >> 0x20 != 0) {
    uVar9 = 1;
    do {
      puVar2 = r + n_00 + n + (uVar9 - 1);
      uVar3 = *puVar2;
      uVar4 = (uint)uVar5;
      *puVar2 = *puVar2 + uVar4;
      if (n_00 <= uVar9) break;
      uVar5 = (ulong)CARRY4(uVar3,uVar4);
      uVar9 = uVar9 + 1;
    } while (CARRY4(uVar3,uVar4));
  }
  lVar6 = 0;
  do {
    bVar10 = 0;
    if (-lVar6 == n_00 * 4) break;
    uVar3 = *(uint *)((long)a + lVar6 + n_00 * 8 + -4);
    uVar4 = *(uint *)((long)a + lVar6 + n_00 * 4 + -4);
    bVar10 = -(uVar3 <= uVar4) | 1;
    lVar6 = lVar6 + -4;
  } while (uVar3 == uVar4);
  if (bVar10 == 1) {
    uVar5 = 0;
    bVar8 = false;
    do {
      uVar9 = ((ulong)a_00[uVar5] - (ulong)bVar8) - (ulong)a[uVar5];
      t[uVar5] = (uint)uVar9;
      bVar8 = uVar9 >> 0x20 != 0;
      uVar5 = uVar5 + 1;
    } while (n_00 != uVar5);
  }
  else if (bVar10 == 0xff) {
    uVar5 = 0;
    bVar8 = false;
    do {
      uVar9 = ((ulong)a[uVar5] - (ulong)bVar8) - (ulong)a_00[uVar5];
      t[uVar5] = (uint)uVar9;
      bVar8 = uVar9 >> 0x20 != 0;
      uVar5 = uVar5 + 1;
    } while (n_00 != uVar5);
  }
  lVar6 = 0;
  do {
    bVar11 = 0;
    if (-lVar6 == n_00 * 4) break;
    uVar3 = *(uint *)((long)b + lVar6 + n_00 * 4 + -4);
    uVar4 = *(uint *)((long)b + lVar6 + n_00 * 8 + -4);
    bVar11 = -(uVar3 <= uVar4) | 1;
    lVar6 = lVar6 + -4;
  } while (uVar3 == uVar4);
  if (bVar11 == 1) {
    uVar5 = 0;
    bVar8 = false;
    do {
      uVar9 = ((ulong)b[uVar5] - (ulong)bVar8) - (ulong)puVar1[uVar5];
      b_00[uVar5] = (uint)uVar9;
      bVar8 = uVar9 >> 0x20 != 0;
      uVar5 = uVar5 + 1;
    } while (n_00 != uVar5);
  }
  else if (bVar11 == 0xff) {
    uVar5 = 0;
    bVar8 = false;
    do {
      uVar9 = ((ulong)puVar1[uVar5] - (ulong)bVar8) - (ulong)b[uVar5];
      b_00[uVar5] = (uint)uVar9;
      bVar8 = uVar9 >> 0x20 != 0;
      uVar5 = uVar5 + 1;
    } while (n_00 != uVar5);
  }
  eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int*,unsigned_int*,unsigned_int*>
            (r_00,t,b_00,n_00,t + n * 2);
  if ((byte)(bVar11 * bVar10) == '\x01') {
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar9 = (ulong)r_00[uVar7] + r[n_00 + uVar7] + uVar5;
      uVar5 = uVar9 >> 0x20;
      r[n_00 + uVar7] = (uint)uVar9;
      uVar7 = uVar7 + 1;
    } while (n != uVar7);
    if (uVar9 >> 0x20 != 0) {
      uVar9 = 1;
      do {
        puVar1 = r + n_00 + n + (uVar9 - 1);
        uVar3 = *puVar1;
        uVar4 = (uint)uVar5;
        *puVar1 = *puVar1 + uVar4;
        if (n_00 <= uVar9) {
          return;
        }
        uVar5 = (ulong)CARRY4(uVar3,uVar4);
        uVar9 = uVar9 + 1;
      } while (CARRY4(uVar3,uVar4));
    }
  }
  else if ((byte)(bVar11 * bVar10) == -1) {
    uVar7 = 0;
    bVar8 = false;
    do {
      uVar5 = ((ulong)r[n_00 + uVar7] - (ulong)bVar8) - (ulong)r_00[uVar7];
      r[n_00 + uVar7] = (uint)uVar5;
      uVar5 = uVar5 >> 0x20;
      bVar8 = uVar5 != 0;
      uVar7 = uVar7 + 1;
    } while (n != uVar7);
    if (uVar5 != 0) {
      uVar5 = 1;
      do {
        uVar3 = r[n_00 + n + (uVar5 - 1)];
        r[n_00 + n + (uVar5 - 1)] = (uint)((ulong)uVar3 - 1);
        if (n_00 <= uVar5) {
          return;
        }
        uVar5 = uVar5 + 1;
      } while ((ulong)uVar3 - 1 >> 0x20 != 0);
    }
  }
  return;
}

Assistant:

static constexpr
    auto eval_multiply_kara_n_by_n_to_2n(      ResultIterator     r, // NOLINT(misc-no-recursion)
                                         const InputIteratorLeft  a,
                                         const InputIteratorRight b,
                                         const unsigned_fast_type n,
                                               InputIteratorTemp  t) -> void
    {
      if(n <= static_cast<unsigned_fast_type>(UINT32_C(48)))
      {
        static_cast<void>(t);

        eval_multiply_n_by_n_to_2n(r, a, b, n);
      }
      else
      {
        static_assert
        (
             (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type>::digits)
          && (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorRight>::value_type>::digits)
          && (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorTemp>::value_type>::digits),
          "Error: Internals require same widths for left-right-result limb_types at the moment"
        );

        using local_limb_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type;

        using result_difference_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::difference_type;
        using left_difference_type   = typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::difference_type;
        using right_difference_type  = typename detail::iterator_detail::iterator_traits<InputIteratorRight>::difference_type;
        using temp_difference_type   = typename detail::iterator_detail::iterator_traits<InputIteratorTemp>::difference_type;

        // Based on "Algorithm 1.3 KaratsubaMultiply", Sect. 1.3.2, page 5
        // of R.P. Brent and P. Zimmermann, "Modern Computer Arithmetic",
        // Cambridge University Press (2011).

        // The Karatsuba multipliation computes the product of u*v as:
        // [b^N + b^(N/2)] a1*b1 + [b^(N/2)](a1 - a0)(b0 - b1) + [b^(N/2) + 1] a0*b0

        // Here we visualize u and v in two components 0,1 corresponding
        // to the high and low order parts, respectively.

        // Step 1
        // Calculate a1*b1 and store it in the upper part of r.
        // Calculate a0*b0 and store it in the lower part of r.
        // copy r to t0.

        // Step 2
        // Add a1*b1 (which is t2) to the middle two-quarters of r (which is r1)
        // Add a0*b0 (which is t0) to the middle two-quarters of r (which is r1)

        // Step 3
        // Calculate |a1-a0| in t0 and note the sign (i.e., the borrow flag)

        // Step 4
        // Calculate |b0-b1| in t1 and note the sign (i.e., the borrow flag)

        // Step 5
        // Call kara mul to calculate |a1-a0|*|b0-b1| in (t2),
        // while using temporary storage in t4 along the way.

        // Step 6
        // Check the borrow signs. If a1-a0 and b0-b1 have the same signs,
        // then add |a1-a0|*|b0-b1| to r1, otherwise subtract it from r1.

        const auto nh = static_cast<unsigned_fast_type>(n / 2U);

        const InputIteratorLeft   a0 = detail::advance_and_point(a, static_cast<left_difference_type>(0));
        const InputIteratorLeft   a1 = detail::advance_and_point(a, static_cast<left_difference_type>(nh));

        const InputIteratorRight  b0 = detail::advance_and_point(b, static_cast<right_difference_type>(0));
        const InputIteratorRight  b1 = detail::advance_and_point(b, static_cast<right_difference_type>(nh));

              ResultIterator      r0 = detail::advance_and_point(r, static_cast<result_difference_type>(0));
              ResultIterator      r1 = detail::advance_and_point(r, static_cast<result_difference_type>(nh));
              ResultIterator      r2 = detail::advance_and_point(r, static_cast<result_difference_type>(n));
              ResultIterator      r3 = detail::advance_and_point(r, static_cast<result_difference_type>(static_cast<result_difference_type>(n) + static_cast<result_difference_type>(nh)));

              InputIteratorTemp   t0 = detail::advance_and_point(t, static_cast<temp_difference_type>(0));
              InputIteratorTemp   t1 = detail::advance_and_point(t, static_cast<temp_difference_type>(nh));
              InputIteratorTemp   t2 = detail::advance_and_point(t, static_cast<temp_difference_type>(n));
              InputIteratorTemp   t4 = detail::advance_and_point(t, static_cast<temp_difference_type>(static_cast<result_difference_type>(n) + static_cast<result_difference_type>(n)));

        // Step 1
        //   a1*b1 -> r2
        //   a0*b0 -> r0
        //   r -> t0
        eval_multiply_kara_n_by_n_to_2n(r2, a1, b1, nh, t0);
        eval_multiply_kara_n_by_n_to_2n(r0, a0, b0, nh, t0);
        detail::copy_unsafe(r0, detail::advance_and_point(r0, static_cast<result_difference_type>(static_cast<result_difference_type>(n) * static_cast<result_difference_type>(2U))), t0);

        // Step 2
        //   r1 += a1*b1
        //   r1 += a0*b0
        auto carry = static_cast<local_limb_type>(eval_add_n(r1, r1, t2, n));
        eval_multiply_kara_propagate_carry(r3, nh, carry);
        carry = static_cast<local_limb_type>(eval_add_n(r1, r1, t0, n));
        eval_multiply_kara_propagate_carry(r3, nh, carry);

        // Step 3
        //   |a1-a0| -> t0
        const auto cmp_result_a1a0 = compare_ranges(a1, a0, nh);

        if(cmp_result_a1a0 == static_cast<std::int_fast8_t>(INT8_C(1)))
        {
          static_cast<void>(eval_subtract_n(t0, a1, a0, nh));
        }
        else if(cmp_result_a1a0 == static_cast<std::int_fast8_t>(INT8_C(-1)))
        {
          static_cast<void>(eval_subtract_n(t0, a0, a1, nh));
        }

        // Step 4
        //   |b0-b1| -> t1
        const auto cmp_result_b0b1 = compare_ranges(b0, b1, nh);

        if(cmp_result_b0b1 == static_cast<std::int_fast8_t>(INT8_C(1)))
        {
          static_cast<void>(eval_subtract_n(t1, b0, b1, nh));
        }
        else if(cmp_result_b0b1 == static_cast<std::int_fast8_t>(INT8_C(-1)))
        {
          static_cast<void>(eval_subtract_n(t1, b1, b0, nh));
        }

        // Step 5
        //   |a1-a0|*|b0-b1| -> t2
        eval_multiply_kara_n_by_n_to_2n(t2, t0, t1, nh, t4);

        // Step 6
        //   either r1 += |a1-a0|*|b0-b1|
        //   or     r1 -= |a1-a0|*|b0-b1|
        if(static_cast<std::int_fast8_t>(cmp_result_a1a0 * cmp_result_b0b1) == static_cast<std::int_fast8_t>(INT8_C(1)))
        {
          carry = eval_add_n(r1, r1, t2, n);

          eval_multiply_kara_propagate_carry(r3, nh, carry);
        }
        else if(static_cast<std::int_fast8_t>(cmp_result_a1a0 * cmp_result_b0b1) == static_cast<std::int_fast8_t>(INT8_C(-1)))
        {
          const auto has_borrow = eval_subtract_n(r1, r1, t2, n);

          eval_multiply_kara_propagate_borrow(r3, nh, has_borrow);
        }
      }
    }